

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testMinMaxEigenValue<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  uint i;
  long lVar1;
  double *pdVar2;
  double (*padVar3) [3];
  uint j;
  long lVar4;
  double dVar5;
  double dVar6;
  Matrix33<double> V;
  Matrix33<double> U;
  TV maxV;
  TV minV;
  TV S;
  undefined8 local_168;
  undefined8 local_160;
  double adStack_158 [7];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  Vec3 local_d8 [24];
  Vec3 local_c0 [24];
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double local_18;
  
  local_120 = 0x3ff0000000000000;
  local_118 = 0;
  uStack_110 = 0;
  lVar1 = 0;
  local_108 = 0;
  local_100 = 0x3ff0000000000000;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_e0 = 0x3ff0000000000000;
  local_168 = 0x3ff0000000000000;
  local_160 = 0;
  adStack_158[0] = 0.0;
  adStack_158[1] = 0.0;
  adStack_158[2] = 1.0;
  adStack_158[3] = 0.0;
  adStack_158[4] = 0.0;
  adStack_158[5] = 0.0;
  adStack_158[6] = 1.0;
  dVar6 = 0.0;
  padVar3 = (double (*) [3])A;
  do {
    lVar4 = 0;
    dVar5 = dVar6;
    do {
      dVar6 = ABS((*(double (*) [3])*padVar3)[lVar4]);
      if (dVar6 <= dVar5) {
        dVar6 = dVar5;
      }
      lVar4 = lVar4 + 1;
      dVar5 = dVar6;
    } while (lVar4 != 3);
    lVar1 = lVar1 + 1;
    padVar3 = padVar3 + 1;
  } while (lVar1 != 3);
  dVar5 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar6) {
    dVar5 = dVar6;
  }
  dVar6 = dVar5 * 100.0 * 2.220446049250313e-16;
  local_58 = A->x[0][0];
  dStack_50 = A->x[0][1];
  local_48 = A->x[0][2];
  dStack_40 = A->x[1][0];
  local_38 = A->x[1][1];
  dStack_30 = A->x[1][2];
  local_28 = A->x[2][0];
  dStack_20 = A->x[2][1];
  local_18 = A->x[2][2];
  Imath_3_2::minEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
            ((Matrix33 *)&local_58,local_c0);
  local_a8 = A->x[0][0];
  dStack_a0 = A->x[0][1];
  local_98 = A->x[0][2];
  dStack_90 = A->x[1][0];
  local_88 = A->x[1][1];
  dStack_80 = A->x[1][2];
  local_78 = A->x[2][0];
  dStack_70 = A->x[2][1];
  local_68 = A->x[2][2];
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
            ((Matrix33 *)&local_a8,local_d8);
  local_58 = A->x[0][0];
  dStack_50 = A->x[0][1];
  local_48 = A->x[0][2];
  dStack_40 = A->x[1][0];
  local_38 = A->x[1][1];
  dStack_30 = A->x[1][2];
  local_28 = A->x[2][0];
  dStack_20 = A->x[2][1];
  local_18 = A->x[2][2];
  lVar1 = 0;
  Imath_3_2::jacobiSVD<double>
            ((Matrix33 *)&local_58,(Matrix33 *)&local_120,(Vec3 *)&local_a8,(Matrix33 *)&local_168,
             2.220446049250313e-16,false);
  pdVar2 = adStack_158;
  while( true ) {
    if (dVar6 <= ABS(*(double *)(local_c0 + lVar1 * 8) - *pdVar2)) {
      __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<double>]"
                   );
    }
    if (dVar6 <= ABS(*(double *)(local_d8 + lVar1 * 8) - pdVar2[-2])) break;
    lVar1 = lVar1 + 1;
    pdVar2 = pdVar2 + 3;
    if (lVar1 == 3) {
      return;
    }
  }
  __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<double>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}